

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::add_variable_to_interface_block
          (CompilerMSL *this,StorageClass storage,string *ib_var_ref,SPIRType *ib_type,
          SPIRVariable *var,InterfaceBlockMeta *meta)

{
  _func_int **pp_Var1;
  TypeID id;
  Variant *pVVar2;
  size_t sVar3;
  BuiltIn BVar4;
  CompilerMSL *this_00;
  SPIRFunction *pSVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  ExecutionModel EVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  SPIRType *type;
  SPIRType *pSVar14;
  ulong uVar15;
  SPIRConstant *pSVar16;
  undefined7 extraout_var;
  CompilerError *this_01;
  uint *ts_1;
  undefined8 unaff_RBP;
  ulong uVar17;
  SPIRVariable *pSVar18;
  ID IVar19;
  BuiltIn builtin;
  InterfaceBlockMeta *local_270;
  SPIRType *local_268;
  uint local_260;
  undefined4 local_25c;
  uint32_t var_mbr_idx;
  uint32_t location;
  string *local_250;
  SPIRType *local_248;
  uint32_t local_23c;
  CompilerMSL *local_238;
  ulong local_230;
  SPIRVariable *local_228;
  uint local_21c;
  string var_name;
  uint32_t initializer;
  undefined4 uStack_1f4;
  char local_1e8 [16];
  uint32_t ptr_type_id;
  undefined4 uStack_1d4;
  char local_1c8 [16];
  SPIRFunction *local_1b8;
  SmallVector<unsigned_int,_8UL> *local_1b0;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *local_1a8;
  ParsedIR *local_1a0;
  uint32_t locn;
  undefined4 uStack_194;
  undefined1 auStack_190 [24];
  __node_base_ptr *local_178;
  size_t sStack_170;
  size_t local_168;
  __node_base_ptr ap_Stack_160 [4];
  bool *local_140;
  size_t local_138;
  bool local_128 [8];
  uint32_t local_120;
  bool local_11c;
  StorageClass local_108;
  TypedID<(spirv_cross::Types)1> *local_100;
  size_t local_f8;
  TypedID<(spirv_cross::Types)1> local_e8 [8];
  uint *local_c8;
  size_t local_c0;
  uint local_b0 [15];
  TypeID local_74;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_70;
  
  pSVar18 = var;
  local_250 = ib_var_ref;
  local_248 = ib_type;
  local_1b8 = Variant::get<spirv_cross::SPIRFunction>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr +
                         (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  local_270 = meta;
  if (meta->strip_array == true) {
    type = Compiler::get_variable_element_type((Compiler *)this,var);
  }
  else {
    type = Compiler::get_variable_data_type((Compiler *)this,var);
  }
  bVar6 = Compiler::is_builtin_variable((Compiler *)this,var);
  builtin = Compiler::get_decoration
                      ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationBuiltIn);
  bVar7 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(type->super_IVariant).self.id,DecorationBlock);
  if ((storage == StorageClassOutput) &&
     (bVar8 = CompilerGLSL::is_stage_output_variable_masked(&this->super_CompilerGLSL,var), bVar8))
  {
    emit_local_masked_variable(this,var,local_270->strip_array);
    return;
  }
  if (storage == StorageClassInput) {
    if ((type->basetype == Struct) &&
       ((((EVar11 = Compiler::get_execution_model((Compiler *)this),
          EVar11 == ExecutionModelTessellationControl &&
          ((this->msl_options).multi_patch_workgroup != false)) ||
         ((EVar11 = Compiler::get_execution_model((Compiler *)this),
          EVar11 == ExecutionModelTessellationEvaluation &&
          ((this->msl_options).raw_buffer_tese_input == true)))) &&
        (bVar8 = Compiler::has_decoration
                           ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationLocation),
        bVar8)))) {
      uVar12 = Compiler::get_decoration
                         ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationLocation);
      locn = uVar12;
      pSVar14 = Compiler::get_variable_data_type((Compiler *)this,var);
      ensure_struct_members_valid_vecsizes(this,pSVar14,&locn);
    }
    bVar8 = Compiler::has_decoration
                      ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationPerVertexKHR);
    if (bVar8) {
      this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_01,"PerVertexKHR decoration is not supported in MSL.");
      goto LAB_002076b0;
    }
  }
  CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,(var->super_IVariant).self.id);
  if (type->basetype == Struct) {
    bVar8 = variable_storage_requires_stage_io(this,storage);
    if ((!bVar8) && (bVar7)) {
      bVar8 = (type->array).super_VectorView<unsigned_int>.buffer_size == 0;
    }
    if (bVar6 || bVar8 != true) {
      uVar17 = 0;
    }
    else {
      uVar17 = CONCAT71((int7)((ulong)unaff_RBP >> 8),local_270->allow_local_declaration);
    }
    if ((char)uVar17 != '\0') {
      emit_local_masked_variable(this,var,local_270->strip_array);
    }
    if (bVar8 == false) {
LAB_00206d88:
      add_plain_variable_to_interface_block(this,storage,local_250,local_248,var,local_270);
      return;
    }
    location = 0xffffffff;
    var_mbr_idx = 0;
    bVar6 = Compiler::is_matrix((Compiler *)this,type);
    bVar8 = Compiler::is_array((Compiler *)this,type);
    if (bVar6) {
      if (bVar8) {
        this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (this_01,"MSL cannot emit arrays-of-matrices in input and output variables.");
LAB_002076b0:
        __cxa_throw(this_01,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_23c = type->columns;
    }
    else {
      local_23c = 1;
      if (bVar8) {
        if ((type->array).super_VectorView<unsigned_int>.buffer_size != 1) {
          this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (this_01,"MSL cannot emit arrays-of-arrays in input and output variables.");
          goto LAB_002076b0;
        }
        local_23c = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,type);
      }
    }
    local_260 = 0;
    local_268 = type;
    local_238 = this;
    if (local_23c == 0) {
      bVar10 = 1;
    }
    else {
      local_21c = (uint)uVar17;
      local_1a0 = &(this->super_CompilerGLSL).super_Compiler.ir;
      local_1a8 = &local_1b8->local_variables;
      local_1b0 = &this->vars_needing_early_declaration;
      local_230 = 0;
      local_228 = var;
      do {
        if ((int)(type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                 .buffer_size != 0) {
          uVar17 = 0;
          do {
            builtin = BuiltInMax;
            uVar12 = (uint32_t)uVar17;
            bVar6 = Compiler::is_member_builtin((Compiler *)this,type,uVar12,&builtin);
            pSVar14 = Variant::get<spirv_cross::SPIRType>
                                ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr +
                                 (type->member_types).
                                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                                 [uVar17].id);
            if ((storage == StorageClassOutput) &&
               (bVar8 = CompilerGLSL::is_stage_output_block_member_masked
                                  (&this->super_CompilerGLSL,var,uVar12,local_270->strip_array),
               bVar8)) {
              location = 0xffffffff;
              local_230 = local_230 & 0xff;
              if (bVar7) {
                local_230 = 1;
              }
              type = local_268;
              if ((bVar6) && (local_270->strip_array == false)) {
                uVar12 = ParsedIR::increase_bound_by(local_1a0,2);
                ptr_type_id = uVar12;
                SPIRType::SPIRType((SPIRType *)&locn,pSVar14);
                local_11c = true;
                local_120 = local_120 + 1;
                local_74.id = (local_268->member_types).
                              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                              [uVar17].id;
                local_108 = StorageClassOutput;
                _initializer = _initializer & 0xffffffff00000000;
                uVar15 = (ulong)(var->initializer).id;
                if (uVar15 != 0) {
                  if ((uVar15 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                                super_VectorView<spirv_cross::Variant>.buffer_size) &&
                     (pVVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr,
                     pVVar2[uVar15].type == TypeConstant)) {
                    pSVar16 = Variant::get<spirv_cross::SPIRConstant>(pVVar2 + uVar15);
                  }
                  else {
                    pSVar16 = (SPIRConstant *)0x0;
                  }
                  if (pSVar16 != (SPIRConstant *)0x0) {
                    initializer = (pSVar16->subconstants).
                                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr
                                  [uVar17].id;
                  }
                }
                Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                          ((Compiler *)this,ptr_type_id,(SPIRType *)&locn);
                IVar19.id = uVar12 + 1;
                var_name._M_dataplus._M_p._0_4_ = 3;
                pSVar18 = (SPIRVariable *)&initializer;
                Compiler::
                set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,unsigned_int&>
                          ((Compiler *)this,IVar19.id,&ptr_type_id,(StorageClass *)&var_name,
                           (uint *)pSVar18);
                pSVar5 = local_1b8;
                SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::reserve
                          (local_1a8,
                           (local_1b8->local_variables).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
                           buffer_size + 1);
                sVar3 = (pSVar5->local_variables).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
                (pSVar5->local_variables).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr[sVar3].id =
                     IVar19.id;
                (pSVar5->local_variables).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size =
                     sVar3 + 1;
                SmallVector<unsigned_int,_8UL>::reserve
                          (local_1b0,
                           (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.
                           buffer_size + 1);
                sVar3 = (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.
                        buffer_size;
                (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.ptr[sVar3] =
                     IVar19.id;
                (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size =
                     sVar3 + 1;
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                          (&var_name,this,(ulong)builtin,3);
                Compiler::set_name((Compiler *)this,IVar19,&var_name);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(var_name._M_dataplus._M_p._4_4_,var_name._M_dataplus._M_p._0_4_) !=
                    &var_name.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT44(var_name._M_dataplus._M_p._4_4_,
                                           var_name._M_dataplus._M_p._0_4_));
                }
                Compiler::set_decoration((Compiler *)this,IVar19,DecorationBuiltIn,builtin);
                _locn = &PTR__SPIRType_00360128;
                ::std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::~_Hashtable(&local_70);
                local_c0 = 0;
                if (local_c8 != local_b0) {
                  free(local_c8);
                }
                type = local_268;
                local_f8 = 0;
                if (local_100 != local_e8) {
                  free(local_100);
                }
                local_138 = 0;
                if (local_140 != local_128) {
                  free(local_140);
                }
                sStack_170 = 0;
                if (local_178 != ap_Stack_160) {
                  free(local_178);
                }
              }
            }
            else if ((!bVar6) ||
                    (bVar8 = Compiler::has_active_builtin((Compiler *)this,builtin,storage),
                    type = local_268, bVar8)) {
              bVar8 = Compiler::is_matrix((Compiler *)this,pSVar14);
              if ((bVar8) || (bVar8 = Compiler::is_array((Compiler *)this,pSVar14), bVar8)) {
                local_25c = 0;
              }
              else {
                local_25c = (undefined4)CONCAT71(extraout_var,pSVar14->basetype != Struct);
              }
              bVar8 = true;
              if (storage == StorageClassInput) {
                EVar11 = Compiler::get_execution_model((Compiler *)this);
                bVar8 = EVar11 == ExecutionModelFragment;
              }
              bVar9 = variable_storage_requires_stage_io(this,storage);
              BVar4 = builtin;
              ts_1 = (uint *)0x1;
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                        (&var_name,this,(ulong)(local_228->super_IVariant).self.id);
              _ptr_type_id = local_1c8;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&ptr_type_id,
                         CONCAT44(var_name._M_dataplus._M_p._4_4_,var_name._M_dataplus._M_p._0_4_),
                         var_name._M_string_length +
                         CONCAT44(var_name._M_dataplus._M_p._4_4_,var_name._M_dataplus._M_p._0_4_));
              _initializer = local_1e8;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&initializer,
                         CONCAT44(var_name._M_dataplus._M_p._4_4_,var_name._M_dataplus._M_p._0_4_),
                         var_name._M_string_length +
                         CONCAT44(var_name._M_dataplus._M_p._4_4_,var_name._M_dataplus._M_p._0_4_));
              if (local_23c != 1) {
                join<char_const(&)[2],unsigned_int&>
                          ((string *)&locn,(spirv_cross *)0x2c1f55,(char (*) [2])&local_260,ts_1);
                ::std::__cxx11::string::_M_append((char *)&ptr_type_id,(ulong)_locn);
                if (_locn != (undefined **)(auStack_190 + 8)) {
                  operator_delete(_locn);
                }
                join<char_const(&)[2],unsigned_int&,char_const(&)[2]>
                          ((string *)&locn,(spirv_cross *)0x2c1a1a,(char (*) [2])&local_260,
                           (uint *)0x2c191f,(char (*) [2])pSVar18);
                ::std::__cxx11::string::_M_append((char *)&initializer,(ulong)_locn);
                if (_locn != (undefined **)(auStack_190 + 8)) {
                  operator_delete(_locn);
                }
              }
              var = local_228;
              this = local_238;
              type = local_268;
              pSVar18 = local_228;
              if (((~bVar9 | (byte)local_25c) & 1) == 0 &&
                  (bVar6 & bVar8 & BVar4 - BuiltInVertexId < 0xfffffffe) == 0) {
                _locn = (_func_int **)0x0;
                auStack_190._0_8_ = ap_Stack_160;
                auStack_190._8_8_ = 1;
                auStack_190._16_4_ = 0;
                auStack_190._20_4_ = 0;
                local_178 = (__node_base_ptr *)0x0;
                sStack_170 = 0x3f800000;
                local_168 = 0;
                ap_Stack_160[0] = (__node_base_ptr)0x0;
                add_composite_member_variable_to_interface_block
                          (local_238,storage,local_250,local_248,local_228,local_268,uVar12,
                           local_270,(string *)&ptr_type_id,(string *)&initializer,&location,
                           &var_mbr_idx,(Bitset *)&locn);
                ::std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                               *)auStack_190);
              }
              else {
                add_plain_member_variable_to_interface_block
                          (local_238,storage,local_250,local_248,local_228,local_268,uVar12,
                           local_270,(string *)&ptr_type_id,(string *)&initializer,&location,
                           &var_mbr_idx);
              }
              if (_initializer != local_1e8) {
                operator_delete(_initializer);
              }
              if (_ptr_type_id != local_1c8) {
                operator_delete(_ptr_type_id);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(var_name._M_dataplus._M_p._4_4_,var_name._M_dataplus._M_p._0_4_) !=
                  &var_name.field_2) {
                operator_delete((undefined1 *)
                                CONCAT44(var_name._M_dataplus._M_p._4_4_,
                                         var_name._M_dataplus._M_p._0_4_));
              }
            }
            var_mbr_idx = var_mbr_idx + 1;
            uVar17 = uVar17 + 1;
          } while (uVar17 < (uint)(type->member_types).
                                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                  buffer_size);
        }
        local_260 = local_260 + 1;
      } while (local_260 < local_23c);
      bVar10 = (byte)local_230 ^ 1;
      uVar17 = (ulong)local_21c;
    }
    if (((((byte)uVar17 | bVar10) & 1) == 0) &&
       ((bVar6 = Compiler::is_builtin_variable((Compiler *)this,var), !bVar6 ||
        (EVar11 = Compiler::get_execution_model((Compiler *)this),
        EVar11 == ExecutionModelTessellationControl)))) {
      bVar6 = Compiler::is_builtin_variable((Compiler *)this,var);
      this_00 = local_238;
      if (bVar6) {
        if ((int)(type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                 .buffer_size != 0) {
          uVar12 = 0;
          do {
            id.id = (type->super_IVariant).self.id;
            uVar13 = Compiler::get_member_decoration
                               ((Compiler *)this_00,id,uVar12,DecorationBuiltIn);
            (*(this_00->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                      ((string *)&locn,this_00,(ulong)uVar13,3);
            Compiler::set_member_name((Compiler *)this_00,id,uVar12,(string *)&locn);
            if (_locn != (undefined **)(auStack_190 + 8)) {
              operator_delete(_locn);
            }
            uVar12 = uVar12 + 1;
            type = local_268;
          } while (uVar12 < (uint)(local_268->member_types).
                                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                  buffer_size);
        }
        IVar19.id = (type->super_IVariant).self.id;
        pp_Var1 = (_func_int **)(auStack_190 + 8);
        _locn = pp_Var1;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&locn,"gl_PerVertex","");
        this = local_238;
        Compiler::set_name((Compiler *)local_238,IVar19,(string *)&locn);
        if ((_func_int **)_locn != pp_Var1) {
          operator_delete(_locn);
        }
        IVar19.id = (var->super_IVariant).self.id;
        _locn = pp_Var1;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&locn,"gl_out_masked","");
        Compiler::set_name((Compiler *)this,IVar19,(string *)&locn);
        if ((_func_int **)_locn != pp_Var1) {
          operator_delete(_locn);
        }
        (this->stage_out_masked_builtin_type_id).id = (local_268->super_IVariant).self.id;
      }
      emit_local_masked_variable(this,var,local_270->strip_array);
    }
  }
  else {
    EVar11 = Compiler::get_execution_model((Compiler *)this);
    if ((((EVar11 == ExecutionModelTessellationEvaluation && storage == StorageClassInput) &&
         (bVar6)) && (local_270->strip_array == false)) && (builtin - BuiltInTessLevelOuter < 2)) {
      add_tess_level_input_to_interface_block(this,local_250,local_248,var);
      return;
    }
    if (((type->basetype < MeshGridProperties) &&
        ((0x8077fcU >> (type->basetype & (MeshGridProperties|Int)) & 1) != 0)) &&
       ((!bVar6 || (bVar7 = Compiler::has_active_builtin((Compiler *)this,builtin,storage), bVar7)))
       ) {
      bVar7 = Compiler::is_matrix((Compiler *)this,type);
      if (bVar7) {
        bVar7 = false;
      }
      else {
        bVar7 = Compiler::is_array((Compiler *)this,type);
        bVar7 = !bVar7;
      }
      bVar8 = variable_storage_requires_stage_io(this,storage);
      bVar9 = true;
      if (storage == StorageClassInput) {
        EVar11 = Compiler::get_execution_model((Compiler *)this);
        bVar9 = EVar11 == ExecutionModelFragment;
      }
      if ((!bVar7 && bVar8) && (bVar6 & bVar9 & builtin - BuiltInVertexId < 0xfffffffe) == 0) {
        add_composite_variable_to_interface_block(this,storage,local_250,local_248,var,local_270);
        return;
      }
      goto LAB_00206d88;
    }
  }
  return;
}

Assistant:

void CompilerMSL::add_variable_to_interface_block(StorageClass storage, const string &ib_var_ref, SPIRType &ib_type,
                                                  SPIRVariable &var, InterfaceBlockMeta &meta)
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
	// Tessellation control I/O variables and tessellation evaluation per-point inputs are
	// usually declared as arrays. In these cases, we want to add the element type to the
	// interface block, since in Metal it's the interface block itself which is arrayed.
	auto &var_type = meta.strip_array ? get_variable_element_type(var) : get_variable_data_type(var);
	bool is_builtin = is_builtin_variable(var);
	auto builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
	bool is_block = has_decoration(var_type.self, DecorationBlock);

	// If stage variables are masked out, emit them as plain variables instead.
	// For builtins, we query them one by one later.
	// IO blocks are not masked here, we need to mask them per-member instead.
	if (storage == StorageClassOutput && is_stage_output_variable_masked(var))
	{
		// If we ignore an output, we must still emit it, since it might be used by app.
		// Instead, just emit it as early declaration.
		emit_local_masked_variable(var, meta.strip_array);
		return;
	}

	// Tesselation stages pass I/O via buffer content which may contain nested structs.
	// Ensure the vector sizes of any nested struct members within these input variables match
	// the vector sizes of the corresponding output variables from the previous pipeline stage.
	// This adjustment is handled here instead of ensure_correct_input_type() in order to
	// perform the necessary recursive processing.
	if (storage == StorageClassInput && var_type.basetype == SPIRType::Struct &&
		((is_tesc_shader() && msl_options.multi_patch_workgroup) ||
		 (is_tese_shader() && msl_options.raw_buffer_tese_input)) &&
		has_decoration(var.self, DecorationLocation))
	{
		uint32_t locn = get_decoration(var.self, DecorationLocation);
		ensure_struct_members_valid_vecsizes(get_variable_data_type(var), locn);
	}

	if (storage == StorageClassInput && has_decoration(var.self, DecorationPerVertexKHR))
		SPIRV_CROSS_THROW("PerVertexKHR decoration is not supported in MSL.");

	// If variable names alias, they will end up with wrong names in the interface struct, because
	// there might be aliases in the member name cache and there would be a mismatch in fixup_in code.
	// Make sure to register the variables as unique resource names ahead of time.
	// This would normally conflict with the name cache when emitting local variables,
	// but this happens in the setup stage, before we hit compilation loops.
	// The name cache is cleared before we actually emit code, so this is safe.
	add_resource_name(var.self);

	if (var_type.basetype == SPIRType::Struct)
	{
		bool block_requires_flattening =
		    variable_storage_requires_stage_io(storage) || (is_block && var_type.array.empty());
		bool needs_local_declaration = !is_builtin && block_requires_flattening && meta.allow_local_declaration;

		if (needs_local_declaration)
		{
			// For I/O blocks or structs, we will need to pass the block itself around
			// to functions if they are used globally in leaf functions.
			// Rather than passing down member by member,
			// we unflatten I/O blocks while running the shader,
			// and pass the actual struct type down to leaf functions.
			// We then unflatten inputs, and flatten outputs in the "fixup" stages.
			emit_local_masked_variable(var, meta.strip_array);
		}

		if (!block_requires_flattening)
		{
			// In Metal tessellation shaders, the interface block itself is arrayed. This makes things
			// very complicated, since stage-in structures in MSL don't support nested structures.
			// Luckily, for stage-out when capturing output, we can avoid this and just add
			// composite members directly, because the stage-out structure is stored to a buffer,
			// not returned.
			add_plain_variable_to_interface_block(storage, ib_var_ref, ib_type, var, meta);
		}
		else
		{
			bool masked_block = false;
			uint32_t location = UINT32_MAX;
			uint32_t var_mbr_idx = 0;
			uint32_t elem_cnt = 1;
			if (is_matrix(var_type))
			{
				if (is_array(var_type))
					SPIRV_CROSS_THROW("MSL cannot emit arrays-of-matrices in input and output variables.");

				elem_cnt = var_type.columns;
			}
			else if (is_array(var_type))
			{
				if (var_type.array.size() != 1)
					SPIRV_CROSS_THROW("MSL cannot emit arrays-of-arrays in input and output variables.");

				elem_cnt = to_array_size_literal(var_type);
			}

			for (uint32_t elem_idx = 0; elem_idx < elem_cnt; elem_idx++)
			{
				// Flatten the struct members into the interface struct
				for (uint32_t mbr_idx = 0; mbr_idx < uint32_t(var_type.member_types.size()); mbr_idx++)
				{
					builtin = BuiltInMax;
					is_builtin = is_member_builtin(var_type, mbr_idx, &builtin);
					auto &mbr_type = get<SPIRType>(var_type.member_types[mbr_idx]);

					if (storage == StorageClassOutput && is_stage_output_block_member_masked(var, mbr_idx, meta.strip_array))
					{
						location = UINT32_MAX; // Skip this member and resolve location again on next var member

						if (is_block)
							masked_block = true;

						// Non-builtin block output variables are just ignored, since they will still access
						// the block variable as-is. They're just not flattened.
						if (is_builtin && !meta.strip_array)
						{
							// Emit a fake variable instead.
							uint32_t ids = ir.increase_bound_by(2);
							uint32_t ptr_type_id = ids + 0;
							uint32_t var_id = ids + 1;

							auto ptr_type = mbr_type;
							ptr_type.pointer = true;
							ptr_type.pointer_depth++;
							ptr_type.parent_type = var_type.member_types[mbr_idx];
							ptr_type.storage = StorageClassOutput;

							uint32_t initializer = 0;
							if (var.initializer)
								if (auto *c = maybe_get<SPIRConstant>(var.initializer))
									initializer = c->subconstants[mbr_idx];

							set<SPIRType>(ptr_type_id, ptr_type);
							set<SPIRVariable>(var_id, ptr_type_id, StorageClassOutput, initializer);
							entry_func.add_local_variable(var_id);
							vars_needing_early_declaration.push_back(var_id);
							set_name(var_id, builtin_to_glsl(builtin, StorageClassOutput));
							set_decoration(var_id, DecorationBuiltIn, builtin);
						}
					}
					else if (!is_builtin || has_active_builtin(builtin, storage))
					{
						bool is_composite_type = is_matrix(mbr_type) || is_array(mbr_type) || mbr_type.basetype == SPIRType::Struct;
						bool attribute_load_store =
								storage == StorageClassInput && get_execution_model() != ExecutionModelFragment;
						bool storage_is_stage_io = variable_storage_requires_stage_io(storage);

						// Clip/CullDistance always need to be declared as user attributes.
						if (builtin == BuiltInClipDistance || builtin == BuiltInCullDistance)
							is_builtin = false;

						const string var_name = to_name(var.self);
						string mbr_name_qual = var_name;
						string var_chain_qual = var_name;
						if (elem_cnt > 1)
						{
							mbr_name_qual += join("_", elem_idx);
							var_chain_qual += join("[", elem_idx, "]");
						}

						if ((!is_builtin || attribute_load_store) && storage_is_stage_io && is_composite_type)
						{
							add_composite_member_variable_to_interface_block(storage, ib_var_ref, ib_type,
							                                                 var, var_type, mbr_idx, meta,
							                                                 mbr_name_qual, var_chain_qual,
							                                                 location, var_mbr_idx, {});
						}
						else
						{
							add_plain_member_variable_to_interface_block(storage, ib_var_ref, ib_type,
							                                             var, var_type, mbr_idx, meta,
							                                             mbr_name_qual, var_chain_qual,
							                                             location, var_mbr_idx);
						}
					}
					var_mbr_idx++;
				}
			}

			// If we're redirecting a block, we might still need to access the original block
			// variable if we're masking some members.
			if (masked_block && !needs_local_declaration && (!is_builtin_variable(var) || is_tesc_shader()))
			{
				if (is_builtin_variable(var))
				{
					// Ensure correct names for the block members if we're actually going to
					// declare gl_PerVertex.
					for (uint32_t mbr_idx = 0; mbr_idx < uint32_t(var_type.member_types.size()); mbr_idx++)
					{
						set_member_name(var_type.self, mbr_idx, builtin_to_glsl(
								BuiltIn(get_member_decoration(var_type.self, mbr_idx, DecorationBuiltIn)),
								StorageClassOutput));
					}

					set_name(var_type.self, "gl_PerVertex");
					set_name(var.self, "gl_out_masked");
					stage_out_masked_builtin_type_id = var_type.self;
				}
				emit_local_masked_variable(var, meta.strip_array);
			}
		}
	}
	else if (is_tese_shader() && storage == StorageClassInput && !meta.strip_array && is_builtin &&
	         (builtin == BuiltInTessLevelOuter || builtin == BuiltInTessLevelInner))
	{
		add_tess_level_input_to_interface_block(ib_var_ref, ib_type, var);
	}
	else if (var_type.basetype == SPIRType::Boolean || var_type.basetype == SPIRType::Char ||
	         type_is_integral(var_type) || type_is_floating_point(var_type))
	{
		if (!is_builtin || has_active_builtin(builtin, storage))
		{
			bool is_composite_type = is_matrix(var_type) || is_array(var_type);
			bool storage_is_stage_io = variable_storage_requires_stage_io(storage);
			bool attribute_load_store = storage == StorageClassInput && get_execution_model() != ExecutionModelFragment;

			// Clip/CullDistance always needs to be declared as user attributes.
			if (builtin == BuiltInClipDistance || builtin == BuiltInCullDistance)
				is_builtin = false;

			// MSL does not allow matrices or arrays in input or output variables, so need to handle it specially.
			if ((!is_builtin || attribute_load_store) && storage_is_stage_io && is_composite_type)
			{
				add_composite_variable_to_interface_block(storage, ib_var_ref, ib_type, var, meta);
			}
			else
			{
				add_plain_variable_to_interface_block(storage, ib_var_ref, ib_type, var, meta);
			}
		}
	}
}